

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhash.c
# Opt level: O1

tommy_uint64_t tommy_hash_u64(tommy_uint64_t init_val,void *void_key,tommy_size_t key_len)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long in_FS_OFFSET;
  
  uVar1 = (int)init_val + (int)key_len + 0xdeadbeef;
  uVar4 = (ulong)((int)init_val + (int)key_len + (int)(init_val >> 0x20) + 0xdeadbeef);
  uVar6 = uVar1;
  if (0xc < key_len) {
    do {
      uVar2 = (int)uVar4 + *(int *)((long)void_key + 8);
      uVar6 = (uVar2 * 0x10 | uVar2 >> 0x1c) ^ (uVar6 + *void_key) - uVar2;
      iVar3 = uVar2 + uVar1 + *(int *)((long)void_key + 4);
      uVar1 = (uVar6 << 6 | uVar6 >> 0x1a) ^ (uVar1 + *(int *)((long)void_key + 4)) - uVar6;
      iVar7 = uVar6 + iVar3;
      uVar2 = (uVar1 << 8 | uVar1 >> 0x18) ^ iVar3 - uVar1;
      iVar3 = uVar1 + iVar7;
      uVar6 = (uVar2 << 0x10 | uVar2 >> 0x10) ^ iVar7 - uVar2;
      iVar7 = uVar2 + iVar3;
      uVar1 = (uVar6 << 0x13 | uVar6 >> 0xd) ^ iVar3 - uVar6;
      uVar6 = uVar6 + iVar7;
      uVar4 = (ulong)((uVar1 << 4 | uVar1 >> 0x1c) ^ iVar7 - uVar1);
      uVar1 = uVar1 + uVar6;
      key_len = key_len - 0xc;
      void_key = (void *)((long)void_key + 0xc);
    } while (0xc < key_len);
  }
  switch(key_len) {
  case 0:
    goto switchD_00105777_caseD_0;
  case 1:
    goto switchD_00105777_caseD_1;
  case 3:
    uVar6 = uVar6 + (uint)*(byte *)((long)void_key + 2) * 0x10000;
  case 2:
    uVar6 = uVar6 + (uint)*(byte *)((long)void_key + 1) * 0x100;
    goto switchD_00105777_caseD_1;
  case 4:
    goto switchD_00105777_caseD_4;
  case 5:
    goto switchD_00105777_caseD_5;
  case 6:
    goto switchD_00105777_caseD_6;
  case 7:
    uVar1 = uVar1 + (uint)*(byte *)((long)void_key + 6) * 0x10000;
    goto switchD_00105777_caseD_6;
  case 9:
    goto switchD_00105777_caseD_9;
  case 10:
    goto switchD_00105777_caseD_a;
  case 0xb:
    uVar4 = (ulong)((int)uVar4 + (uint)*(byte *)((long)void_key + 10) * 0x10000);
    goto switchD_00105777_caseD_a;
  case 0xc:
    uVar4 = (ulong)(uint)((int)uVar4 + *(int *)((long)void_key + 8));
  }
switchD_00105777_caseD_8:
  uVar1 = uVar1 + *(int *)((long)void_key + 4);
switchD_00105777_caseD_4:
  uVar6 = uVar6 + *void_key;
LAB_001057ce:
  uVar2 = ((uint)uVar4 ^ uVar1) - (uVar1 << 0xe | uVar1 >> 0x12);
  uVar5 = (uVar6 ^ uVar2) - (uVar2 * 0x800 | uVar2 >> 0x15);
  uVar6 = (uVar1 ^ uVar5) - (uVar5 * 0x2000000 | uVar5 >> 7);
  uVar2 = (uVar2 ^ uVar6) - (uVar6 * 0x10000 | uVar6 >> 0x10);
  uVar1 = (uVar5 ^ uVar2) - (uVar2 * 0x10 | uVar2 >> 0x1c);
  uVar1 = (uVar6 ^ uVar1) - (uVar1 * 0x4000 | uVar1 >> 0x12);
  uVar4 = (ulong)((uVar2 ^ uVar1) - (uVar1 * 0x1000000 | uVar1 >> 8));
switchD_00105777_caseD_0:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (ulong)uVar1 << 0x20 | uVar4;
  }
  __stack_chk_fail();
switchD_00105777_caseD_a:
  uVar4 = (ulong)((int)uVar4 + (uint)*(byte *)((long)void_key + 9) * 0x100);
switchD_00105777_caseD_9:
  uVar4 = (ulong)((int)uVar4 + (uint)*(byte *)((long)void_key + 8));
  goto switchD_00105777_caseD_8;
switchD_00105777_caseD_6:
  uVar1 = uVar1 + (uint)*(byte *)((long)void_key + 5) * 0x100;
switchD_00105777_caseD_5:
  uVar1 = uVar1 + *(byte *)((long)void_key + 4);
  goto switchD_00105777_caseD_4;
switchD_00105777_caseD_1:
  uVar6 = uVar6 + *void_key;
  goto LAB_001057ce;
}

Assistant:

tommy_uint64_t tommy_hash_u64(tommy_uint64_t init_val, const void* void_key, tommy_size_t key_len)
{
	const unsigned char* key = tommy_cast(const unsigned char*, void_key);
	tommy_uint32_t a, b, c;

	a = b = c = 0xdeadbeef + ((tommy_uint32_t)key_len) + (init_val & 0xffffffff);
	c += init_val >> 32;

	while (key_len > 12) {
		a += tommy_le_uint32_read(key + 0);
		b += tommy_le_uint32_read(key + 4);
		c += tommy_le_uint32_read(key + 8);

		tommy_mix(a, b, c);

		key_len -= 12;
		key += 12;
	}

	switch (key_len) {
	case 0 :
		return c + ((tommy_uint64_t)b << 32); /* used only when called with a zero length */
	case 12 :
		c += tommy_le_uint32_read(key + 8);
		b += tommy_le_uint32_read(key + 4);
		a += tommy_le_uint32_read(key + 0);
		break;
	case 11 : c += ((tommy_uint32_t)key[10]) << 16; /* fallthrough */
	case 10 : c += ((tommy_uint32_t)key[9]) << 8; /* fallthrough */
	case 9 : c += key[8]; /* fallthrough */
	case 8 :
		b += tommy_le_uint32_read(key + 4);
		a += tommy_le_uint32_read(key + 0);
		break;
	case 7 : b += ((tommy_uint32_t)key[6]) << 16; /* fallthrough */
	case 6 : b += ((tommy_uint32_t)key[5]) << 8; /* fallthrough */
	case 5 : b += key[4]; /* fallthrough */
	case 4 :
		a += tommy_le_uint32_read(key + 0);
		break;
	case 3 : a += ((tommy_uint32_t)key[2]) << 16; /* fallthrough */
	case 2 : a += ((tommy_uint32_t)key[1]) << 8; /* fallthrough */
	case 1 : a += key[0]; /* fallthrough */
	}

	tommy_final(a, b, c);

	return c + ((tommy_uint64_t)b << 32);
}